

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void setGetterMethod(Pager *pPager)

{
  Pager *pPager_local;
  
  if (pPager->errCode == 0) {
    if (pPager->bUseFetch == '\0') {
      pPager->xGet = getPageNormal;
    }
    else {
      pPager->xGet = getPageMMap;
    }
  }
  else {
    pPager->xGet = getPageError;
  }
  return;
}

Assistant:

static void setGetterMethod(Pager *pPager){
  if( pPager->errCode ){
    pPager->xGet = getPageError;
#if SQLITE_MAX_MMAP_SIZE>0
  }else if( USEFETCH(pPager)
#ifdef SQLITE_HAS_CODEC
   && pPager->xCodec==0
#endif
  ){
    pPager->xGet = getPageMMap;
#endif /* SQLITE_MAX_MMAP_SIZE>0 */
  }else{
    pPager->xGet = getPageNormal;
  }
}